

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O2

int mtar_write_data(mtar_t *tar,void *data,size_t size)

{
  size_t *psVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = (*tar->write)(tar,data,size);
  sVar3 = tar->pos + size;
  tar->pos = sVar3;
  if (iVar2 == 0) {
    iVar2 = 0;
    psVar1 = &tar->remaining_data;
    *psVar1 = *psVar1 - size;
    if (*psVar1 == 0) {
      iVar2 = mtar_write_null_bytes(tar,(ulong)(-(int)sVar3 & 0x1ff));
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mtar_write_data(mtar_t *tar, const void *data, size_t size) {
  int err;
  /* Write data */
  err = mtar_twrite(tar, data, size);
  if (err) {
    return err;
  }
  tar->remaining_data -= size;
  /* Write padding if we've written all the data for this file */
  if (tar->remaining_data == 0) {
    return mtar_write_null_bytes(tar, mtar_round_up(tar->pos, 512) - tar->pos);
  }
  return MTAR_ESUCCESS;
}